

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::SingularFieldHelper<10>::
Serialize<google::protobuf::internal::ArrayOutput>
          (SingularFieldHelper<10> *this,void *field,FieldMetadata *md,ArrayOutput *output)

{
  WriteTagTo<google::protobuf::internal::ArrayOutput>
            (*(uint32 *)((long)field + 4),(ArrayOutput *)md);
  SerializeGroupTo<google::protobuf::internal::ArrayOutput>
            (*(internal **)this,*(MessageLite **)((long)field + 0x10),md,output);
  WriteTagTo<google::protobuf::internal::ArrayOutput>
            (*(int *)((long)field + 4) + 1,(ArrayOutput *)md);
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    WriteTagTo(md.tag, output);
    SerializeGroupTo(Get<const MessageLite*>(field),
                     static_cast<const SerializationTable*>(md.ptr), output);
    WriteTagTo(md.tag + 1, output);
  }